

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

Symbol * __thiscall Parse::SMTLIB2::getSymbol(SMTLIB2 *this,DeclaredSymbol *s)

{
  if ((ulong)s->second < 3) {
    return *(Symbol **)
            (*(long *)(DAT_00b7e1b0 + 0x60 + (ulong)s->second * 0x20) + (ulong)s->first * 8);
  }
  return (Symbol *)0x0;
}

Assistant:

Signature::Symbol* SMTLIB2::getSymbol(DeclaredSymbol& s) {
  Signature::Symbol* sym = nullptr;
  switch (s.second)
  {
  case SymbolType::FUNCTION: {
    sym = env.signature->getFunction(s.first);
    break;
  }
  case SymbolType::PREDICATE: {
    sym = env.signature->getPredicate(s.first);
    break;
  }
  case SymbolType::TYPECON: {
    sym = env.signature->getTypeCon(s.first);
    break;
  }
  }

  return sym;
}